

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::WaveletTransform2D
               (Mat *src,Mat *dest,double *P,double *Q,int fsize,int *ww,int *wh,int stop_after)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  int local_f4;
  _OutputArray local_f0;
  _InputArray local_d8;
  int local_c0;
  int local_bc;
  int k_1;
  int k;
  int b;
  int loop_count;
  _InputArray local_88;
  undefined1 local_70 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  int height;
  int width;
  int local_48;
  int local_44;
  int input_h;
  int input_w;
  Size imageSize;
  int *ww_local;
  int fsize_local;
  double *Q_local;
  double *P_local;
  Mat *dest_local;
  Mat *src_local;
  
  imageSize = (Size)ww;
  if (*(long *)(src + 0x10) == 0) {
    this = std::operator<<((ostream *)&std::cerr,"gmg_WaveletTransform2D() src == NULL");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    cv::MatSize::operator()((MatSize *)&input_h);
    local_44 = input_h;
    local_48 = input_w;
    if (stop_after < 0) {
      if (input_h < input_w) {
        local_f4 = input_w;
      }
      else {
        local_f4 = input_h;
      }
      stop_after = local_f4;
    }
    cv::Size_<int>::Size_((Size_<int> *)&height,(Size_<int> *)&input_h);
    iVar2 = cv::Mat::type(src);
    cv::Mat::create(dest,(Size_<int> *)&height,iVar2);
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._4_4_ = input_h;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._0_4_ = input_w;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70);
    cv::_InputArray::_InputArray(&local_88,src);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)&b,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70);
    cv::split(&local_88,(_OutputArray *)&b);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&b);
    cv::_InputArray::~_InputArray(&local_88);
    k = 0;
    while( true ) {
      bVar1 = false;
      if ((((fsize <= components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_) &&
           (bVar1 = false,
           fsize <= (int)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage)) &&
          (bVar1 = false,
          components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ % 2 == 0)) &&
         (bVar1 = false,
         (int)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage % 2 == 0)) {
        bVar1 = k < stop_after;
      }
      if (!bVar1) break;
      k_1 = 0;
      while( true ) {
        uVar3 = (ulong)k_1;
        sVar4 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70);
        if (sVar4 <= uVar3) break;
        for (local_bc = 0;
            local_bc <
            (int)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; local_bc = local_bc + 1) {
          pvVar5 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70,(long)k_1);
          Wavegeneral_h(pvVar5,local_bc,
                        components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,0,P,Q,fsize);
        }
        for (local_c0 = 0;
            local_c0 <
            components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_; local_c0 = local_c0 + 1) {
          pvVar5 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70,(long)k_1);
          Wavegeneral_v(pvVar5,local_c0,
                        (int)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0,P,Q,fsize);
        }
        k_1 = k_1 + 1;
      }
      *wh = (int)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      *(int *)imageSize =
           components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ / 2;
      components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage / 2;
      k = k + 1;
    }
    cv::_InputArray::_InputArray(&local_d8,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70);
    cv::_OutputArray::_OutputArray(&local_f0,dest);
    cv::merge(&local_d8,&local_f0);
    cv::_OutputArray::~_OutputArray(&local_f0);
    cv::_InputArray::~_InputArray(&local_d8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_70);
  }
  return;
}

Assistant:

void lts2::WaveletTransform2D(const cv::Mat& src, cv::Mat& dest, 
                              double *P, double *Q, int fsize, int *ww, int *wh, int stop_after)
{
  if (!src.data) 
  {
    std::cerr << "gmg_WaveletTransform2D() src == NULL" << std::endl;
    return;
  }
	
  cv::Size imageSize = src.size();
    
  int input_w = imageSize.width;
  int input_h = imageSize.height;
	
  if (stop_after < 0) 
    stop_after = MAX(input_w, input_h);
	
  dest.create(imageSize, src.type());
	
  int width = imageSize.width;//XBDW(src)-XBUP(src);
  int height = imageSize.height;//YBDW(src)-YBUP(src);
	
  std::vector<cv::Mat> components;
  cv::split(src, components);
	
  int loop_count = 0;
  while(width>=fsize && height>=fsize && !(width%2) && !(height%2) && loop_count < stop_after) 
  {
		
    for(int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
        
    *wh = height;
    *ww = width;
		
    width /= 2; 
    height /= 2;
		
    ++loop_count;    
  }
	
  cv::merge(components, dest);
}